

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

UConverterType ucnv_getType_63(UConverter *converter)

{
  UConverterSharedData *pUVar1;
  UConverterType UVar2;
  
  UVar2 = (UConverterType)converter->sharedData->staticData->conversionType;
  if (UVar2 != UCNV_MBCS) {
    return UVar2;
  }
  pUVar1 = converter->sharedData;
  UVar2 = UCNV_SBCS;
  if ((((pUVar1->mbcs).countStates != '\x01') &&
      (UVar2 = UCNV_EBCDIC_STATEFUL, (pUVar1->mbcs).outputType != '\f')) &&
     ((pUVar1->staticData->minBytesPerChar != '\x02' ||
      (UVar2 = UCNV_DBCS, pUVar1->staticData->maxBytesPerChar != '\x02')))) {
    UVar2 = UCNV_MBCS;
  }
  return UVar2;
}

Assistant:

U_CAPI UConverterType  U_EXPORT2
ucnv_getType(const UConverter* converter)
{
    int8_t type = converter->sharedData->staticData->conversionType;
#if !UCONFIG_NO_LEGACY_CONVERSION
    if(type == UCNV_MBCS) {
        return ucnv_MBCSGetType(converter);
    }
#endif
    return (UConverterType)type;
}